

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O2

bool __thiscall FButtonStatus::ReleaseKey(FButtonStatus *this,int keynum)

{
  BYTE BVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  BVar1 = this->bDown;
  if ((keynum & 0x7fffU) == 0) {
    for (uVar3 = 5; -1 < (int)uVar3; uVar3 = uVar3 - 1) {
      this->Keys[uVar3] = 0;
    }
    this->bWentUp = '\x01';
  }
  else {
    uVar3 = 0xffffffff;
    iVar2 = 0;
    for (uVar4 = 5; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
      iVar2 = (iVar2 + 1) - (uint)(this->Keys[uVar4] == 0);
      if ((keynum & 0x7fffU) == (uint)this->Keys[uVar4]) {
        uVar3 = uVar4;
      }
    }
    if ((int)uVar3 < 0) {
      return false;
    }
    this->Keys[uVar3] = 0;
    this->bWentUp = '\x01';
    if (iVar2 != 1) {
      bVar5 = this->bDown == '\0';
      goto LAB_00375b69;
    }
  }
  this->bDown = '\0';
  bVar5 = true;
LAB_00375b69:
  return (bool)(BVar1 != '\0' & bVar5);
}

Assistant:

bool FButtonStatus::ReleaseKey (int keynum)
{
	int i, numdown, match;
	BYTE wasdown = bDown;

	keynum &= KEY_DBLCLICKED-1;

	if (keynum == 0)
	{ // Issued from console instead of a key, so force off
		for (i = MAX_KEYS-1; i >= 0; --i)
		{
			Keys[i] = 0;
		}
		bWentUp = true;
		bDown = false;
	}
	else
	{
		for (i = MAX_KEYS-1, numdown = 0, match = -1; i >= 0; --i)
		{
			if (Keys[i] != 0)
			{
				++numdown;
				if (Keys[i] == keynum)
				{
					match = i;
				}
			}
		}
		if (match < 0)
		{ // Key was not down; do nothing
			return false;
		}
		Keys[match] = 0;
		bWentUp = true;
		if (--numdown == 0)
		{
			bDown = false;
		}
	}
	// Returns true if releasing this key caused the button to go up.
	return wasdown && !bDown;
}